

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O3

void init_get_head(int type,MemoryNode **free,MemoryNode **used)

{
  MemoryNode **ppMVar1;
  MemoryNode **ppMVar2;
  
  if (type == 0) {
    ppMVar1 = &data_free_memory_head;
    ppMVar2 = &data_used_memory_head;
  }
  else {
    if (type != 1) {
      return;
    }
    ppMVar1 = &code_free_memory_head;
    ppMVar2 = &code_used_memory_head;
  }
  *used = *ppMVar2;
  *free = *ppMVar1;
  return;
}

Assistant:

void init_get_head(int type, MemoryNode *&free, MemoryNode *&used) {
	if (type == 0) {
		used = data_used_memory_head;
		free= data_free_memory_head;
	}
	if (type == 1) {
		used = code_used_memory_head;
		free = code_free_memory_head;
	}
}